

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O2

char * strchrrep(char *haystack,char needle,char replacement)

{
  code *pcVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  
  if (haystack != (char *)0x0) {
    sVar2 = strlen(haystack);
    uVar5 = sVar2 & 0xffffffff;
    pcVar3 = haystack;
    while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
      if (*pcVar3 == needle) {
        *pcVar3 = replacement;
      }
      if (SBORROW4((int)sVar2,1)) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      pcVar3 = pcVar3 + 1;
      sVar2 = uVar5;
    }
  }
  return haystack;
}

Assistant:

char * strchrrep(char * haystack, char needle, char replacement)
{
	char *  c=0;
	int     length=0;

	if(!haystack)
		return haystack;

	for(c=haystack,length=strlen(haystack);length;length--,c++)
	{
		if(*c==needle)
			*c = replacement;
	}

	return haystack;
}